

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      if (0 < m) {
        prVar1 = a[lVar2];
        lVar3 = 0;
        do {
          prVar1[lVar3] = prVar1[lVar3] * c;
          lVar3 = lVar3 + 1;
        } while (m != lVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != n);
  }
  return;
}

Assistant:

void denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}